

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  ostream *poVar2;
  Executor *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings_1;
  shared_ptr<tf::WorkerInterface> local_238;
  Future<void> local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  Taskflow taskflow;
  
  if (argc != 2) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"usage: ./parallel_sort s|p");
    std::endl<char,std::char_traits<char>>(poVar2);
LAB_00104ac3:
    exit(1);
  }
  if (*argv[1] == 'p') {
    random_strings_abi_cxx11_();
    std::operator<<((ostream *)&std::cout,"Taskflow Parallel Sort ... ");
    std::chrono::_V2::steady_clock::now();
    tf::Taskflow::Taskflow(&taskflow);
    uVar1 = std::thread::hardware_concurrency();
    local_238.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_238.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    tf::Executor::Executor((Executor *)&strings,(ulong)uVar1,&local_238);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_238.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    tf::FlowBuilder::
    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((FlowBuilder *)&local_228,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&taskflow,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )strings_1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    this = (Executor *)&strings;
    tf::Executor::run(&local_228,this,&taskflow);
    std::__basic_future<void>::wait((__basic_future<void> *)&local_228,this);
    tf::Future<void>::~Future(&local_228);
    tf::Executor::~Executor((Executor *)&strings);
    tf::Taskflow::~Taskflow(&taskflow);
    std::chrono::_V2::steady_clock::now();
    poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
    std::operator<<(poVar2," ms\n");
    this_00 = &strings_1;
  }
  else {
    if (*argv[1] != 's') {
      poVar2 = std::operator<<((ostream *)&std::cerr,"uncognized method character \'");
      poVar2 = std::operator<<(poVar2,*argv[1]);
      std::operator<<(poVar2,"\'\n");
      goto LAB_00104ac3;
    }
    random_strings_abi_cxx11_();
    std::operator<<((ostream *)&std::cout,"std::sort ... ");
    std::chrono::_V2::steady_clock::now();
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (strings.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               strings.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::chrono::_V2::steady_clock::now();
    poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
    std::operator<<(poVar2," ms\n");
    this_00 = &strings;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_00);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {

  if(argc != 2) {
    std::cerr << "usage: ./parallel_sort s|p" << std::endl;
    std::exit(EXIT_FAILURE);
  }

  // sequential sort
  if(argv[1][0] == 's') {
    auto strings = random_strings();
    std::cout << "std::sort ... ";
    auto beg = std::chrono::steady_clock::now();
    std::sort(strings.begin(), strings.end());
    auto end = std::chrono::steady_clock::now();
    std::cout << std::chrono::duration_cast<std::chrono::milliseconds>(end-beg).count()
              << " ms\n";
  }
  // parallel sort
  else if(argv[1][0] == 'p') {
    auto strings = random_strings();
    std::cout << "Taskflow Parallel Sort ... ";
    auto beg = std::chrono::steady_clock::now();
    {
      tf::Taskflow taskflow;
      tf::Executor executor;
      taskflow.sort(strings.begin(), strings.end());
      executor.run(taskflow).wait();
    }
    auto end = std::chrono::steady_clock::now();
    std::cout << std::chrono::duration_cast<std::chrono::milliseconds>(end-beg).count()
              << " ms\n";
  }
  else {
    std::cerr << "uncognized method character '" << argv[1][0] << "'\n";
    std::exit(EXIT_FAILURE);
  }

  return 0;
}